

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

void __thiscall depspawn::internal::TaskPool::~TaskPool(TaskPool *this)

{
  TaskPool *in_RDI;
  
  wait(in_RDI,(void *)0x0);
  std::function<void_()>::~function((function<void_()> *)0x13392d);
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::~LinkedListPool
            ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)this);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue((queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *)this)
  ;
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue((queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *)this)
  ;
  ThreadPool::~ThreadPool(&this->thread_pool_);
  return;
}

Assistant:

~TaskPool()
  {
    wait(false);
  }